

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O0

int str_num_base(char **linep,curl_off_t *nump,curl_off_t max,int base)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int n_1;
  int n;
  int m;
  char *p;
  curl_off_t num;
  int base_local;
  curl_off_t max_local;
  curl_off_t *nump_local;
  char **linep_local;
  
  p = (char *)0x0;
  if (base == 10) {
    cVar1 = '9';
  }
  else {
    cVar1 = '7';
    if (base == 0x10) {
      cVar1 = 'f';
    }
  }
  *nump = 0;
  _n = *linep;
  if (((*_n < '0') || (cVar1 < *_n)) || ("\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*_n + -0x30] == '\0'))
  {
    linep_local._4_4_ = 8;
  }
  else {
    if (max < base) {
      do {
        pcVar2 = _n + 1;
        p = (char *)((long)p * (long)base +
                    (long)(int)(uint)("\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*_n + -0x30] & 0xf));
        if (max < (long)p) {
          return 7;
        }
        bVar3 = false;
        if (('/' < *pcVar2) && (bVar3 = false, *pcVar2 <= cVar1)) {
          bVar3 = "\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*pcVar2 + -0x30] != '\0';
        }
        _n = pcVar2;
      } while (bVar3);
    }
    else {
      do {
        pcVar2 = _n + 1;
        if ((max - (int)(uint)("\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*_n + -0x30] & 0xf)) /
            (long)base < (long)p) {
          return 7;
        }
        p = (char *)((long)p * (long)base +
                    (long)(int)(uint)("\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*_n + -0x30] & 0xf));
        bVar3 = false;
        if (('/' < *pcVar2) && (bVar3 = false, *pcVar2 <= cVar1)) {
          bVar3 = "\x10\x01\x02\x03\x04\x05\x06\a\b\t"[*pcVar2 + -0x30] != '\0';
        }
        _n = pcVar2;
      } while (bVar3);
    }
    *nump = (curl_off_t)p;
    *linep = _n;
    linep_local._4_4_ = 0;
  }
  return linep_local._4_4_;
}

Assistant:

static int str_num_base(const char **linep, curl_off_t *nump, curl_off_t max,
                        int base) /* 8, 10 or 16, nothing else */
{
  curl_off_t num = 0;
  const char *p;
  int m = (base == 10) ? '9' :   /* the largest digit possible */
    (base == 16) ? 'f' : '7';
  DEBUGASSERT(linep && *linep && nump);
  DEBUGASSERT((base == 8) || (base == 10) || (base == 16));
  DEBUGASSERT(max >= 0); /* mostly to catch SIZE_T_MAX, which is too large */
  *nump = 0;
  p = *linep;
  if(!valid_digit(*p, m))
    return STRE_NO_NUM;
  if(max < base) {
    /* special-case low max scenario because check needs to be different */
    do {
      int n = Curl_hexval(*p++);
      num = num * base + n;
      if(num > max)
        return STRE_OVERFLOW;
    } while(valid_digit(*p, m));
  }
  else {
    do {
      int n = Curl_hexval(*p++);
      if(num > ((max - n) / base))
        return STRE_OVERFLOW;
      num = num * base + n;
    } while(valid_digit(*p, m));
  }
  *nump = num;
  *linep = p;
  return STRE_OK;
}